

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O2

iterator __thiscall
prevector<16U,_unsigned_char,_unsigned_int,_int>::erase
          (prevector<16U,_unsigned_char,_unsigned_int,_int> *this,iterator first,iterator last)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *ppVar4;
  iterator iVar5;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = this->_size;
  uVar3 = uVar1 - 0x11;
  if (uVar1 < 0x11) {
    uVar3 = uVar1;
  }
  ppVar4 = (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
           (this->_union).indirect_contents.indirect;
  if (uVar1 < 0x11) {
    ppVar4 = this;
  }
  this->_size = ((int)first.ptr - (int)last.ptr) + uVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    iVar5.ptr = (uchar *)memmove(first.ptr,last.ptr,
                                 (long)ppVar4 + ((long)(int)uVar3 - (long)last.ptr));
    return (iterator)iVar5.ptr;
  }
  __stack_chk_fail();
}

Assistant:

iterator erase(iterator first, iterator last) {
        // Erase is not allowed to the change the object's capacity. That means
        // that when starting with an indirectly allocated prevector with
        // size and capacity > N, the result may be a still indirectly allocated
        // prevector with size <= N and capacity > N. A shrink_to_fit() call is
        // necessary to switch to the (more efficient) directly allocated
        // representation (with capacity N and size <= N).
        iterator p = first;
        char* endp = (char*)&(*end());
        _size -= last - p;
        memmove(&(*first), &(*last), endp - ((char*)(&(*last))));
        return first;
    }